

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::ResolveFuncTypesExprVisitorDelegate::ResolveBlockDeclaration
          (ResolveFuncTypesExprVisitorDelegate *this,Location *loc,BlockDeclaration *decl)

{
  ResolveFuncTypeWithEmptySignature(this->module_,decl);
  if ((((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x3fffffffcU) == 0) &&
     (((long)(decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x3fffffff8U) == 0)) {
    return;
  }
  ResolveImplicitlyDefinedFunctionType(loc,this->module_,decl);
  return;
}

Assistant:

void ResolveBlockDeclaration(const Location& loc, BlockDeclaration* decl) {
    ResolveFuncTypeWithEmptySignature(*module_, decl);
    if (!IsInlinableFuncSignature(decl->sig)) {
      ResolveImplicitlyDefinedFunctionType(loc, module_, *decl);
    }
  }